

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

int ImPlot::LabelAxisValue
              (ImPlotAxis *axis,ImPlotTickCollection *ticks,double value,char *buff,int size)

{
  ImPlotTime *pIVar1;
  bool bVar2;
  uint uVar3;
  ImPlotTick *pIVar4;
  size_t __maxlen;
  undefined4 in_R9D;
  float fVar5;
  double dVar6;
  ImPlotTime IVar7;
  ImPlotDateTimeFmt IVar8;
  ImPlotDateTimeFmt fmt;
  double local_d0;
  ImPlotTimeUnit local_a4;
  double range;
  undefined2 local_80;
  uint local_6c;
  time_t local_58;
  int local_50;
  ImPlotTimeUnit local_44;
  ImPlotContext *pIStack_40;
  ImPlotTimeUnit unit;
  ImPlotContext *gp;
  ImPlotTime *pIStack_30;
  int size_local;
  char *buff_local;
  double value_local;
  ImPlotTickCollection *ticks_local;
  ImPlotAxis *axis_local;
  
  pIStack_40 = GImPlot;
  gp._4_4_ = size;
  pIStack_30 = (ImPlotTime *)buff;
  buff_local = (char *)value;
  value_local = (double)ticks;
  ticks_local = (ImPlotTickCollection *)axis;
  bVar2 = ImHasFlag<int,ImPlotAxisFlags_>(axis->Flags,ImPlotAxisFlags_Time);
  if (bVar2) {
    if (*(int *)((long)&(ticks_local->TextBuffer).Buf.Data + 4) == 0) {
      dVar6 = ImPlotRange::Size((ImPlotRange *)&(ticks_local->Ticks).Data);
      fVar5 = ImRect::GetWidth(&pIStack_40->CurrentPlot->PlotRect);
      local_a4 = GetUnitForRange(dVar6 / (double)(fVar5 / 100.0));
    }
    else {
      dVar6 = ImPlotRange::Size((ImPlotRange *)&(ticks_local->Ticks).Data);
      fVar5 = ImRect::GetHeight(&pIStack_40->CurrentPlot->PlotRect);
      local_a4 = GetUnitForRange(dVar6 / (double)(fVar5 / 100.0));
    }
    local_44 = local_a4;
    IVar7 = ImPlotTime::FromDouble((double)buff_local);
    pIVar1 = pIStack_30;
    uVar3 = gp._4_4_;
    local_58 = IVar7.S;
    local_50 = IVar7.Us;
    IVar8 = GetDateTimeFmt((ImPlotDateTimeFmt *)TimeFormatMouseCursor,local_44);
    local_80 = IVar8._8_2_;
    local_6c = CONCAT22(local_6c._2_2_,local_80);
    fmt.Time = 0;
    fmt.Date = local_6c;
    fmt.UseISO8601 = (bool)(char)in_R9D;
    fmt.Use24HourClock = (bool)(char)((uint)in_R9D >> 8);
    fmt._10_2_ = (short)((uint)in_R9D >> 0x10);
    axis_local._4_4_ =
         FormatDateTime((ImPlot *)&local_58,pIVar1,(char *)(ulong)uVar3,IVar8.Date,fmt);
  }
  else {
    if (*(int *)((long)value_local + 0x34) < 2) {
      local_d0 = ImPlotRange::Size((ImPlotRange *)&(ticks_local->Ticks).Data);
    }
    else {
      pIVar4 = ImVector<ImPlotTick>::operator[]((ImVector<ImPlotTick> *)value_local,1);
      local_d0 = pIVar4->PlotPos;
      pIVar4 = ImVector<ImPlotTick>::operator[]((ImVector<ImPlotTick> *)value_local,0);
      local_d0 = local_d0 - pIVar4->PlotPos;
    }
    pIVar1 = pIStack_30;
    __maxlen = (size_t)(int)gp._4_4_;
    uVar3 = Precision(local_d0);
    axis_local._4_4_ = snprintf((char *)pIVar1,__maxlen,"%.*f",buff_local,(ulong)uVar3);
  }
  return axis_local._4_4_;
}

Assistant:

int LabelAxisValue(const ImPlotAxis& axis, const ImPlotTickCollection& ticks, double value, char* buff, int size) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(axis.Flags, ImPlotAxisFlags_Time)) {
        ImPlotTimeUnit unit = (axis.Orientation == ImPlotOrientation_Horizontal)
                            ? GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetWidth() / 100))
                            : GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetHeight() / 100));
        return FormatDateTime(ImPlotTime::FromDouble(value), buff, size, GetDateTimeFmt(TimeFormatMouseCursor, unit));
    }
    else {
        double range = ticks.Size > 1 ? (ticks.Ticks[1].PlotPos - ticks.Ticks[0].PlotPos) : axis.Range.Size();
        return snprintf(buff, size, "%.*f", Precision(range), value);
    }
}